

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O3

void __thiscall
ser::CentralizedFileFormat::OpenStreamRead
          (CentralizedFileFormat *this,ifstream *stream,string *fieldName,Savepoint *savepoint)

{
  ostream *poVar1;
  offset_t oVar2;
  SerializationException exception;
  SerializationException anon_var_0;
  ostringstream errorstr;
  ostringstream fname;
  undefined1 *local_318;
  undefined1 local_308 [360];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->super_FileFormat).directory_._M_dataplus._M_p,
                      (this->super_FileFormat).directory_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->super_FileFormat).prefix_._M_dataplus._M_p,
                      (this->super_FileFormat).prefix_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(fieldName->_M_dataplus)._M_p,fieldName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
  oVar2 = OffsetTable::GetOffset((this->super_FileFormat).pOffsetTable_,savepoint,fieldName);
  std::__cxx11::stringbuf::str();
  std::ifstream::open((char *)stream,(_Ios_Openmode)local_318);
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  std::istream::seekg(stream,oVar2,0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void CentralizedFileFormat::OpenStreamRead(std::ifstream& stream, const std::string& fieldName, const Savepoint& savepoint) const
{
    std::ostringstream fname;
    fname << directory_ << "/" << prefix_ << "_" << fieldName << ".dat";

    // Check if field is already saved at savepoint and get offset
    OffsetTable::offset_t offset;
    try {
        offset = pOffsetTable_->GetOffset(savepoint, fieldName);
    }
    catch (SerializationException)
    {
        // Throw more detailed exception
        std::ostringstream errorstr;
        errorstr << "Error: field " << fieldName << " is not saved into serializer "
            << "at savepoint " << savepoint.ToString();
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    stream.open(fname.str().c_str(), std::ios::binary);
    stream.seekg(offset);
}